

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20250127::container_internal::SampleHashtablezInfo<false>
               (size_t sizeof_slot,size_t sizeof_key,size_t sizeof_value,long old_capacity,
               undefined8 param_5,CommonFields *param_6)

{
  bool bVar1;
  CommonFields *c_local;
  bool was_soo_local;
  size_t old_capacity_local;
  size_t sizeof_value_local;
  size_t sizeof_key_local;
  size_t sizeof_slot_local;
  
  bVar1 = HashtablezInfoHandle::IsSampled((HashtablezInfoHandle *)((long)&sizeof_slot_local + 7));
  if (!bVar1) {
    if (old_capacity == 0) {
      Sample(sizeof_slot,sizeof_key,sizeof_value,0);
    }
    else {
      CommonFields::infoz(param_6);
    }
  }
  return;
}

Assistant:

HashtablezInfoHandle SampleHashtablezInfo(size_t sizeof_slot, size_t sizeof_key,
                                          size_t sizeof_value,
                                          size_t old_capacity, bool was_soo,
                                          HashtablezInfoHandle forced_infoz,
                                          CommonFields& c) {
  if (forced_infoz.IsSampled()) return forced_infoz;
  // In SOO, we sample on the first insertion so if this is an empty SOO case
  // (e.g. when reserve is called), then we still need to sample.
  if (kSooEnabled && was_soo && c.size() == 0) {
    return Sample(sizeof_slot, sizeof_key, sizeof_value, SooCapacity());
  }
  // For non-SOO cases, we sample whenever the capacity is increasing from zero
  // to non-zero.
  if (!kSooEnabled && old_capacity == 0) {
    return Sample(sizeof_slot, sizeof_key, sizeof_value, 0);
  }
  return c.infoz();
}